

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Operation<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<double,_duckdb::hugeint_t> *state,double *x,hugeint_t *y,
          AggregateBinaryInput *binary)

{
  double dVar1;
  bool bVar2;
  hugeint_t y_data;
  
  if (*this != (ArgMinMaxBase<duckdb::LessThan,false>)0x0) {
    y_data.upper = (int64_t)y;
    y_data.lower = (uint64_t)x[1];
    Execute<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>>
              (this,(ArgMinMaxState<double,_duckdb::hugeint_t> *)*x,*(double *)state,y_data,binary);
    return;
  }
  bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)y[1].lower,y[2].lower);
  if (bVar2) {
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)y->upper,y[1].upper);
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)!bVar2;
    if (bVar2) {
      *(undefined8 *)(this + 8) = *(undefined8 *)state;
    }
    dVar1 = x[1];
    *(double *)(this + 0x10) = *x;
    *(double *)(this + 0x18) = dVar1;
    *this = (ArgMinMaxBase<duckdb::LessThan,false>)0x1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}